

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::deleteTextures(ReferenceContext *this,int numTextures,deUint32 *textures)

{
  Texture *texture;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)numTextures;
  if (numTextures < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    if (textures[uVar1] != 0) {
      texture = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,textures[uVar1]);
      if (texture != (Texture *)0x0) {
        deleteTexture(this,texture);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::deleteTextures (int numTextures, const deUint32* textures)
{
	for (int i = 0; i < numTextures; i++)
	{
		deUint32	name		= textures[i];
		Texture*	texture		= name ? m_textures.find(name) : DE_NULL;

		if (texture)
			deleteTexture(texture);
	}
}